

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O3

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<float>>(Op op,SquareMatrix<float> *A)

{
  long lVar1;
  float fVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  
  if ((op != NoTrans) && (lVar3 = A->size_, 1 < lVar3)) {
    pfVar4 = (A->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    pfVar6 = pfVar4 + lVar3;
    pfVar4 = pfVar4 + 1;
    lVar7 = 0;
    do {
      lVar8 = 1;
      pfVar5 = pfVar6;
      do {
        fVar2 = pfVar4[lVar8 + -1];
        pfVar4[lVar8 + -1] = *pfVar5;
        *pfVar5 = fVar2;
        lVar1 = lVar7 + lVar8;
        lVar8 = lVar8 + 1;
        pfVar5 = pfVar5 + lVar3;
      } while (lVar1 + 1 < lVar3);
      pfVar4 = pfVar4 + lVar3 + 1;
      pfVar6 = pfVar6 + lVar3 + 1;
      bVar9 = lVar7 != lVar3 + -2;
      lVar7 = lVar7 + 1;
    } while (bVar9);
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }